

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O0

bool RESTERR(HTTPRequest *req,HTTPStatusCode status,string *message)

{
  string_view reply;
  int in_ESI;
  char *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&local_6a[0]._M_dataplus._M_p + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this = local_6a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  HTTPRequest::WriteHeader
            ((HTTPRequest *)this,
             (string *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)local_6a);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  std::allocator<char>::~allocator((allocator<char> *)((long)&local_6a[0]._M_dataplus._M_p + 1));
  std::operator+(__lhs,in_RDI);
  _Var1 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
  reply._M_str = (char *)_Var1._M_len;
  reply._M_len = (size_t)__lhs;
  HTTPRequest::WriteReply((HTTPRequest *)this,in_ESI,reply);
  std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

static bool RESTERR(HTTPRequest* req, enum HTTPStatusCode status, std::string message)
{
    req->WriteHeader("Content-Type", "text/plain");
    req->WriteReply(status, message + "\r\n");
    return false;
}